

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<crc32_variant_braid_Test>::CreateTest
          (ParameterizedTestFactory<crc32_variant_braid_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<crc32_test>::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x18);
  crc32_variant_braid_Test::crc32_variant_braid_Test((crc32_variant_braid_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }